

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

float tcu::refract(float i,float n,float eta)

{
  float fVar1;
  float fVar2;
  float k;
  float cosAngle;
  float eta_local;
  float n_local;
  float i_local;
  
  fVar1 = n * i;
  fVar2 = -(eta * eta) * (-fVar1 * fVar1 + 1.0) + 1.0;
  if (0.0 <= fVar2) {
    fVar2 = deFloatSqrt(fVar2);
    n_local = eta * i + -((eta * fVar1 + fVar2) * n);
  }
  else {
    n_local = 0.0;
  }
  return n_local;
}

Assistant:

inline float refract		(float i, float n, float eta)
{
	float cosAngle = (n * i);
	float k = 1.0f - eta * eta * (1.0f - cosAngle * cosAngle);
	if (k < 0.0f)
		return 0.0f;
	else
		return eta * i - (eta * cosAngle + deFloatSqrt(k)) * n;
}